

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.cpp
# Opt level: O0

QList<int> * __thiscall QVersionNumber::segments(QVersionNumber *this)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  SegmentStorage *in_RSI;
  QList<int> *in_RDI;
  qsizetype i;
  QList<int> *result;
  QList<int> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  reference in_stack_ffffffffffffffa8;
  QList<int> *in_stack_ffffffffffffffb0;
  QVersionNumber *this_00;
  QVersionNumber *local_30;
  
  bVar1 = SegmentStorage::isUsingPointer(in_RSI);
  if (bVar1) {
    QList<int>::QList((QList<int> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
  }
  else {
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
    QList<int>::QList((QList<int> *)0x6376a2);
    segmentCount((QVersionNumber *)0x6376ac);
    QList<int>::resize(in_stack_ffffffffffffffb0,(qsizetype)in_stack_ffffffffffffffa8);
    local_30 = (QVersionNumber *)0x0;
    while (this_00 = local_30, qVar3 = segmentCount((QVersionNumber *)0x6376d8),
          (long)this_00 < qVar3) {
      iVar2 = segmentAt(this_00,(qsizetype)in_stack_ffffffffffffffa8);
      in_stack_ffffffffffffffa8 =
           QList<int>::operator[]
                     ((QList<int> *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),
                      (qsizetype)in_stack_ffffffffffffff98);
      *in_stack_ffffffffffffffa8 = iVar2;
      local_30 = (QVersionNumber *)((long)&(local_30->m_segments).field_0 + 1);
    }
  }
  return in_RDI;
}

Assistant:

QList<int> QVersionNumber::segments() const
{
    if (m_segments.isUsingPointer())
        return *m_segments.pointer_segments;

    QList<int> result;
    result.resize(segmentCount());
    for (qsizetype i = 0; i < segmentCount(); ++i)
        result[i] = segmentAt(i);
    return result;
}